

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,BinaryExpr *node)

{
  ostream *poVar1;
  pointer pEVar2;
  string local_38;
  BinaryExpr *local_18;
  BinaryExpr *node_local;
  PrettyPrinter *this_local;
  
  local_18 = node;
  node_local = (BinaryExpr *)this;
  std::operator<<((ostream *)&std::cout,"(");
  tokTypeToString_abi_cxx11_(&local_38,local_18->m_op);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_38);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string((string *)&local_38);
  pEVar2 = std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::operator->
                     (&local_18->m_left);
  (*(pEVar2->super_Stmt)._vptr_Stmt[2])(pEVar2,this);
  std::operator<<((ostream *)&std::cout," ");
  pEVar2 = std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::operator->
                     (&local_18->m_right);
  (*(pEVar2->super_Stmt)._vptr_Stmt[2])(pEVar2,this);
  std::operator<<((ostream *)&std::cout,")");
  return;
}

Assistant:

void PrettyPrinter::visit(AST::BinaryExpr *node) {
    std::cout << "(";
    std::cout << tokTypeToString(node->m_op) << " ";
    node->m_left->accept(this);
    std::cout << " ";
    node->m_right->accept(this);
    std::cout << ")";
}